

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite_info.hpp
# Opt level: O2

suite_info *
beast::unit_test::make_suite_info<jbcoin::tests::ValidatorKeys_test>
          (suite_info *__return_storage_ptr__,string *name,string *module,string *library,
          bool manual)

{
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  string local_90;
  string local_70;
  string local_50;
  
  ::std::__cxx11::string::string((string *)&local_50,(string *)name);
  ::std::__cxx11::string::string((string *)&local_70,(string *)module);
  ::std::__cxx11::string::string((string *)&local_90,(string *)library);
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a0 = ::std::
             _Function_handler<void_(beast::unit_test::runner_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/beast/extras/beast/unit_test/suite_info.hpp:112:9)>
             ::_M_invoke;
  local_a8 = ::std::
             _Function_handler<void_(beast::unit_test::runner_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/beast/extras/beast/unit_test/suite_info.hpp:112:9)>
             ::_M_manager;
  suite_info::suite_info
            (__return_storage_ptr__,&local_50,&local_70,&local_90,manual,(run_type *)&local_b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

suite_info
make_suite_info(
    std::string name,
    std::string module,
    std::string library,
    bool manual)
{
    return suite_info(
        std::move(name),
        std::move(module),
        std::move(library),
        manual,
        [](runner& r)
        {
            Suite{}(r);
        }
    );
}